

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::GeneratedMessageReflection::SetRepeatedEnum
          (GeneratedMessageReflection *this,Message *message,FieldDescriptor *field,int index,
          EnumValueDescriptor *value)

{
  ExtensionSet *this_00;
  
  if (*(Descriptor **)(field + 0x38) != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"SetRepeatedEnum","Field does not match message type.");
  }
  if (*(int *)(field + 0x30) != 3) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"SetRepeatedEnum",
               "Field is singular; the method requires a repeated field.");
  }
  if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x2c) * 4) != 8) {
    anon_unknown_0::ReportReflectionUsageTypeError
              (this->descriptor_,field,"SetRepeatedEnum",CPPTYPE_ENUM);
  }
  if (*(long *)(value + 0x18) != *(long *)(field + 0x50)) {
    anon_unknown_0::ReportReflectionUsageEnumTypeError
              (this->descriptor_,field,"SetRepeatedEnum",value);
  }
  if (field[0x34] == (FieldDescriptor)0x1) {
    this_00 = MutableExtensionSet(this,message);
    ExtensionSet::SetRepeatedEnum(this_00,*(int *)(field + 0x28),index,*(int *)(value + 0x10));
    return;
  }
  SetRepeatedField<int>(this,message,field,index,*(int *)(value + 0x10));
  return;
}

Assistant:

void GeneratedMessageReflection::SetRepeatedEnum(
    Message* message,
    const FieldDescriptor* field, int index,
    const EnumValueDescriptor* value) const {
  USAGE_CHECK_ALL(SetRepeatedEnum, REPEATED, ENUM);
  USAGE_CHECK_ENUM_VALUE(SetRepeatedEnum);

  if (field->is_extension()) {
    MutableExtensionSet(message)->SetRepeatedEnum(
      field->number(), index, value->number());
  } else {
    SetRepeatedField<int>(message, field, index, value->number());
  }
}